

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

bool libcellml::reachableEquivalence(VariablePtr *variable1,VariablePtr *variable2)

{
  bool bVar1;
  bool local_46;
  undefined1 local_38 [8];
  ParentedEntityPtr parent2;
  ParentedEntityPtr parent1;
  VariablePtr *variable2_local;
  VariablePtr *variable1_local;
  
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             variable1);
  ParentedEntity::parent
            ((ParentedEntity *)
             &parent2.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             variable2);
  ParentedEntity::parent((ParentedEntity *)local_38);
  bVar1 = isEntityChildOf((ParentedEntityPtr *)
                          &parent2.
                           super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,(ParentedEntityPtr *)local_38);
  local_46 = true;
  if (!bVar1) {
    bVar1 = isEntityChildOf((ParentedEntityPtr *)local_38,
                            (ParentedEntityPtr *)
                            &parent2.
                             super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
    local_46 = true;
    if (!bVar1) {
      local_46 = areEntitiesSiblings((ParentedEntityPtr *)
                                     &parent2.
                                      super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,(ParentedEntityPtr *)local_38);
    }
  }
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
            ((shared_ptr<libcellml::ParentedEntity> *)local_38);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
            ((shared_ptr<libcellml::ParentedEntity> *)
             &parent2.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return local_46;
}

Assistant:

bool reachableEquivalence(const VariablePtr &variable1, const VariablePtr &variable2)
{
    auto parent1 = variable1->parent();
    auto parent2 = variable2->parent();

    return isEntityChildOf(parent1, parent2)
           || isEntityChildOf(parent2, parent1)
           || areEntitiesSiblings(parent1, parent2);
}